

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void __thiscall PosixRunWriter::flush(PosixRunWriter *this)

{
  int __fd;
  bool bVar1;
  uchar *__buf;
  size_type sVar2;
  ssize_t sVar3;
  runtime_error *this_00;
  int *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    (in_stack_ffffffffffffffd0);
  if (!bVar1) {
    __fd = *in_RDI;
    __buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1b7848);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 6));
    sVar3 = ::write(__fd,__buf,sVar2);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 6));
    if (sVar3 != (int)sVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Failed to flush PosixRunWriter");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1b78f2);
  }
  return;
}

Assistant:

void PosixRunWriter::flush() {
    if (!buffer_.empty()) {
        if (::write(fd_, buffer_.data(), buffer_.size()) !=
            static_cast<int>(buffer_.size())) {
            throw std::runtime_error("Failed to flush PosixRunWriter");
        }
        buffer_.clear();
    }
}